

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_communicate.hpp
# Opt level: O0

void MPIX_INAPsend(void *buf,NAPComm *nap_comm,MPI_Datatype datatype,int tag,MPI_Comm comm,
                  NAPData *nap_data)

{
  int iVar1;
  NAPCommData *this;
  char *pcVar2;
  int in_ECX;
  MPI_Datatype in_RDX;
  undefined8 *in_RSI;
  undefined8 in_R8;
  undefined8 *in_R9;
  char *unpacked_buf;
  MPI_Request *L_send_requests;
  MPI_Request *recv_requests;
  MPI_Request *send_requests;
  char *L_send_buffer;
  char *global_send_buffer;
  char *local_S_recv_data;
  char *local_L_recv_data;
  int ctr;
  int type_size;
  int size;
  int local_L_tag;
  int local_S_tag;
  NAPCommData *nap_send_data;
  MPI_Comm in_stack_ffffffffffffff58;
  NAPCommData *datatype_00;
  undefined8 in_stack_ffffffffffffff68;
  int tag_00;
  char **recv_data;
  MPI_Request *send_requests_00;
  comm_pkg *comm_00;
  MPI_Comm mpi_comm;
  MPI_Datatype recv_type;
  MPI_Request *send_requests_01;
  comm_pkg *comm_01;
  undefined1 local_54 [4];
  undefined4 in_stack_ffffffffffffffb0;
  
  tag_00 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  this = (NAPCommData *)operator_new(0x28);
  NAPCommData::NAPCommData(this);
  in_R9[3] = in_R8;
  this->datatype = in_RDX;
  this->tag = in_ECX;
  iVar1 = in_ECX + 3;
  comm_01 = (comm_pkg *)0x0;
  send_requests_01 = (MPI_Request *)0x0;
  recv_type = (MPI_Datatype)0x0;
  mpi_comm = (MPI_Comm)0x0;
  comm_00 = (comm_pkg *)in_RSI[5];
  send_requests_00 = (MPI_Request *)in_RSI[6];
  recv_data = (char **)0x0;
  datatype_00 = this;
  MPI_Type_size(in_RDX,local_54);
  MPIX_step_comm(comm_00,send_requests_00,recv_data,tag_00,(MPI_Comm)datatype_00,
                 (MPI_Datatype)in_stack_ffffffffffffff58,recv_type,send_requests_01,
                 (MPI_Request *)comm_01);
  if (*(int *)(*(long *)(in_RSI[2] + 8) + 4) != 0) {
    pcVar2 = MPIX_NAP_unpack((char *)recv_data,tag_00,(MPI_Datatype)datatype_00,
                             in_stack_ffffffffffffff58);
    MPIX_step_send(comm_01,send_requests_01,(int)((ulong)recv_type >> 0x20),mpi_comm,
                   (MPI_Datatype)comm_00,send_requests_00,
                   (char **)CONCAT44(iVar1,in_stack_ffffffffffffffb0));
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
  }
  if (**(int **)*in_RSI != 0) {
    MPIX_step_send(comm_01,send_requests_01,(int)((ulong)recv_type >> 0x20),mpi_comm,
                   (MPI_Datatype)comm_00,send_requests_00,
                   (char **)CONCAT44(iVar1,in_stack_ffffffffffffffb0));
  }
  this->global_buffer = (char *)recv_type;
  this->local_L_buffer = (char *)mpi_comm;
  *in_R9 = this;
  if ((send_requests_01 != (MPI_Request *)0x0) && (send_requests_01 != (MPI_Request *)0x0)) {
    operator_delete__(send_requests_01);
  }
  return;
}

Assistant:

static void MPIX_INAPsend(void* buf, NAPComm* nap_comm,
        MPI_Datatype datatype, int tag,
        MPI_Comm comm, NAPData* nap_data)
{
    NAPCommData* nap_send_data = new NAPCommData();
    nap_data->mpi_comm = comm;
    nap_send_data->datatype = datatype;
    nap_send_data->tag = tag;

    int local_S_tag = tag + 1;
    int local_L_tag = tag + 3;
    int size, type_size, ctr;

    char* local_L_recv_data = NULL;
    char* local_S_recv_data = NULL;
    char* global_send_buffer = NULL;
    char* L_send_buffer = NULL;
    MPI_Request* send_requests = nap_comm->send_requests;
    MPI_Request* recv_requests = nap_comm->recv_requests;
    MPI_Request* L_send_requests = NULL;

    MPI_Type_size(datatype, &type_size);

    // Initial intra-node redistribution (step 1 in nap comm)
    MPIX_step_comm(nap_comm->local_S_comm, buf, &local_S_recv_data,
            local_S_tag, nap_comm->topo_info->local_comm, datatype, datatype,
            send_requests, recv_requests);

    if (nap_comm->local_S_comm->recv_data->size_msgs)
    {
        // Unpack previous recv into void*
        char* unpacked_buf = MPIX_NAP_unpack(local_S_recv_data, 
                nap_comm->local_S_comm->recv_data->size_msgs,
                datatype, comm);

        // Initialize Isends for inter-node step (step 2 in nap comm)
        MPIX_step_send(nap_comm->global_comm, local_S_recv_data, tag,
                comm, datatype, send_requests, &global_send_buffer);

        // Free void* buffer (packed into char* buf)
        delete[] unpacked_buf;
    }

    if (nap_comm->local_L_comm->send_data->num_msgs)
    {
        L_send_requests = &(send_requests[nap_comm->global_comm->send_data->num_msgs]);
        MPIX_step_send(nap_comm->local_L_comm, buf, local_L_tag, 
                nap_comm->topo_info->local_comm, datatype, L_send_requests, &L_send_buffer);
    }

    // Store global_send_requests and global_send_buffer, as to not free data
    // before sends are finished
    nap_send_data->global_buffer = global_send_buffer;
    nap_send_data->local_L_buffer = L_send_buffer;
    nap_data->send_data = nap_send_data;

    if (local_S_recv_data) delete[] local_S_recv_data;
}